

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

LY_ERR lyxp_expr_parse(ly_ctx *ctx,char *expr_str,size_t expr_len,ly_bool reparse,lyxp_expr **expr_p
                      )

{
  char *pcVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  char *pcVar5;
  lyxp_expr **pplVar6;
  LY_ERR LVar7;
  int iVar8;
  LY_ERR LVar9;
  lyxp_expr *exp;
  lyxp_token *plVar10;
  uint32_t *puVar11;
  ulong uVar12;
  ushort **ppuVar13;
  ssize_t sVar14;
  lyxp_expr_type **pplVar15;
  bool bVar16;
  uint uVar17;
  undefined7 in_register_00000009;
  lyxp_token token;
  size_t str_len;
  uint32_t tok_pos;
  long lVar18;
  bool bVar19;
  uint32_t tok_idx;
  undefined8 in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  uint32_t local_4c;
  ulong local_48;
  undefined4 local_3c;
  lyxp_expr **local_38;
  
  local_4c = 0;
  if (expr_p == (lyxp_expr **)0x0) {
    __assert_fail("expr_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0xb52,
                  "LY_ERR lyxp_expr_parse(const struct ly_ctx *, const char *, size_t, ly_bool, struct lyxp_expr **)"
                 );
  }
  if (*expr_str == '\0') {
    ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Unexpected XPath expression end.");
  }
  else {
    if (expr_len == 0) {
      expr_len = strlen(expr_str);
    }
    if (expr_len >> 0x20 == 0) {
      exp = (lyxp_expr *)calloc(1,0x30);
      if (exp != (lyxp_expr *)0x0) {
        local_3c = (undefined4)CONCAT71(in_register_00000009,reparse);
        LVar7 = lydict_insert(ctx,expr_str,expr_len,&exp->expr);
        if (LVar7 != LY_SUCCESS) goto LAB_001a8165;
        exp->used = 0;
        exp->size = 10;
        plVar10 = (lyxp_token *)malloc(0x28);
        exp->tokens = plVar10;
        if (plVar10 != (lyxp_token *)0x0) {
          puVar11 = (uint32_t *)malloc(0x28);
          exp->tok_pos = puVar11;
          if (puVar11 != (uint32_t *)0x0) {
            puVar11 = (uint32_t *)malloc(0x28);
            exp->tok_len = puVar11;
            if (puVar11 != (uint32_t *)0x0) {
              pcVar5 = exp->expr;
              lVar18 = 0;
              while (((ulong)(byte)pcVar5[lVar18] < 0x21 &&
                     ((0x100002600U >> ((ulong)(byte)pcVar5[lVar18] & 0x3f) & 1) != 0))) {
                lVar18 = lVar18 + 1;
              }
              bVar16 = false;
              bVar19 = false;
              local_38 = expr_p;
              do {
                bVar3 = pcVar5[lVar18];
                if (0x5a < bVar3) {
                  if (bVar3 == 0x5b) {
                    token = LYXP_TOKEN_BRACK1;
                  }
                  else {
                    if (bVar3 != 0x5d) goto LAB_001a7a54;
                    token = LYXP_TOKEN_BRACK2;
                  }
                  goto LAB_001a7bbf;
                }
                if (bVar3 != 0x28) {
                  if (bVar3 == 0x29) {
                    token = LYXP_TOKEN_PAR2;
                    goto LAB_001a7bbf;
                  }
LAB_001a7a54:
                  pcVar1 = pcVar5 + lVar18;
                  iVar8 = strncmp(pcVar1,"..",2);
                  if (iVar8 == 0) {
                    token = LYXP_TOKEN_DDOT;
LAB_001a7c1f:
                    str_len = 2;
                    goto LAB_001a7bc5;
                  }
                  str_len = 1;
                  if (0x2b < bVar3) {
                    token = LYXP_TOKEN_COMMA;
                    if (bVar3 != 0x2c) {
                      if (bVar3 == 0x2e) {
                        ppuVar13 = __ctype_b_loc();
                        if ((*(byte *)((long)*ppuVar13 + (long)pcVar1[1] * 2 + 1) & 8) != 0)
                        goto LAB_001a7d8d;
                        token = LYXP_TOKEN_DOT;
                        goto LAB_001a7bbf;
                      }
                      if (bVar3 != 0x40) goto LAB_001a7cf6;
                      str_len = 1;
                      token = LYXP_TOKEN_AT;
                    }
                    goto LAB_001a7bc5;
                  }
                  if (bVar3 == 0x22) {
                    str_len = 2;
                    while( true ) {
                      if (pcVar1[str_len - 1] == '\0') goto LAB_001a819f;
                      if (pcVar1[str_len - 1] == '\"') break;
                      str_len = str_len + 1;
                    }
LAB_001a7d83:
                    token = LYXP_TOKEN_LITERAL;
                    goto LAB_001a7bc5;
                  }
                  if (bVar3 == 0x27) {
                    str_len = 2;
                    while( true ) {
                      if (pcVar1[str_len - 1] == '\0') goto LAB_001a819f;
                      if (pcVar1[str_len - 1] == '\'') break;
                      str_len = str_len + 1;
                    }
                    goto LAB_001a7d83;
                  }
LAB_001a7cf6:
                  local_48 = (ulong)(char)bVar3;
                  ppuVar13 = __ctype_b_loc();
                  if ((*(byte *)((long)*ppuVar13 + local_48 * 2 + 1) & 8) != 0) {
LAB_001a7d8d:
                    ppuVar13 = __ctype_b_loc();
                    str_len = 0xffffffffffffffff;
                    do {
                      lVar2 = str_len + 1;
                      str_len = str_len + 1;
                    } while ((*(byte *)((long)*ppuVar13 + (long)pcVar1[lVar2] * 2 + 1) & 8) != 0);
                    token = LYXP_TOKEN_NUMBER;
                    if (pcVar1[lVar2] == '.') {
                      do {
                        lVar2 = str_len + 1;
                        str_len = str_len + 1;
                      } while ((*(byte *)((long)*ppuVar13 + (long)pcVar1[lVar2] * 2 + 1) & 8) != 0);
                    }
                    goto LAB_001a7bc5;
                  }
                  if (bVar3 == 0x2f) {
                    iVar8 = strncmp(pcVar1,"//",2);
                    str_len = (ulong)(iVar8 == 0) + 1;
                    token = iVar8 == 0 | LYXP_TOKEN_OPER_PATH;
                    goto LAB_001a7bc5;
                  }
                  if (bVar3 == 0x24) {
                    lVar2 = lVar18 + 1;
                    lVar18 = lVar18 + 1;
                    str_len = parse_ncname(in_stack_ffffffffffffff80);
                    if ((long)str_len < 1) {
                      lVar18 = lVar18 - str_len;
                      goto LAB_001a81ca;
                    }
                    token = LYXP_TOKEN_VARREF;
                    if (pcVar5[str_len + lVar2] != ':') goto LAB_001a7bc5;
                    ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Variable with prefix is not supported.");
                    goto LAB_001a81ba;
                  }
                  iVar8 = strncmp(pcVar1,"!=",2);
                  if (iVar8 == 0) {
                    token = LYXP_TOKEN_OPER_NEQUAL;
                    goto LAB_001a7c1f;
                  }
                  iVar8 = strncmp(pcVar1,"<=",2);
                  if ((iVar8 == 0) || (iVar8 = strncmp(pcVar1,">=",2), iVar8 == 0)) {
                    str_len = 2;
LAB_001a7e6f:
                    token = LYXP_TOKEN_OPER_COMP;
                    goto LAB_001a7bc5;
                  }
                  if ((byte)local_48 < 0x3d) {
                    if (((byte)local_48 != 0x2b) && ((byte)local_48 != 0x2d)) {
                      if ((byte)local_48 == 0x3c) {
LAB_001a7ea6:
                        str_len = 1;
                        goto LAB_001a7e6f;
                      }
LAB_001a7eb8:
                      tok_pos = (uint32_t)lVar18;
                      if (exp->used == 0) {
LAB_001a7ef0:
                        str_len = 1;
                        if ((bVar3 == 0x2a) ||
                           (str_len = parse_ncname(in_stack_ffffffffffffff80), 0 < (long)str_len)) {
                          lVar2 = lVar18 + str_len;
                          iVar8 = strncmp(pcVar5 + lVar2,"::",2);
                          if (iVar8 == 0) {
                            LVar7 = expr_parse_axis(pcVar1,str_len);
                            if (LVar7 != LY_SUCCESS) goto LAB_001a81ca;
                            LVar7 = exp_add_token(ctx,exp,LYXP_TOKEN_AXISNAME,tok_pos,
                                                  (uint32_t)str_len);
                            if ((LVar7 != LY_SUCCESS) ||
                               (LVar7 = exp_add_token(ctx,exp,LYXP_TOKEN_DCOLON,(uint32_t)lVar2,2),
                               LVar7 != LY_SUCCESS)) goto LAB_001a8165;
                            lVar18 = lVar2 + 2;
                            str_len = 1;
                            if ((pcVar5[lVar2 + 2] != '*') &&
                               (str_len = parse_ncname(in_stack_ffffffffffffff80), (long)str_len < 1
                               )) goto LAB_001a8232;
                          }
                          pcVar1 = pcVar5 + lVar18;
                          if (pcVar1[str_len] != ':') {
                            bVar19 = *pcVar1 != '*';
                            bVar16 = iVar8 != 0 && bVar19;
                            token = LYXP_TOKEN_NAMETEST;
                            goto LAB_001a7bc5;
                          }
                          if (pcVar1[str_len + 1] == '*') {
                            str_len = str_len + 2;
                          }
                          else {
                            sVar14 = parse_ncname(in_stack_ffffffffffffff80);
                            if (sVar14 < 1) {
                              lVar18 = lVar18 - sVar14;
                              goto LAB_001a81ca;
                            }
                            str_len = str_len + 1 + sVar14;
                          }
                          token = LYXP_TOKEN_NAMETEST;
                          goto LAB_001a7c95;
                        }
LAB_001a8232:
                        lVar18 = lVar18 - str_len;
LAB_001a81ca:
                        tok_pos = (uint32_t)lVar18;
                        uVar12 = (ulong)(uint)(int)pcVar5[lVar18];
                      }
                      else {
                        uVar17 = exp->used - 1;
                        if ((exp->tokens[uVar17] < LYXP_TOKEN_AXISNAME) &&
                           ((0x3fc18aU >> (exp->tokens[uVar17] & (LYXP_TOKEN_NUMBER|LYXP_TOKEN_AT))
                            & 1) != 0)) goto LAB_001a7ef0;
                        if (bVar3 == 0x2a) {
                          str_len = 1;
LAB_001a80a9:
                          token = LYXP_TOKEN_OPER_MATH;
                          goto LAB_001a7bc5;
                        }
                        iVar8 = strncmp(pcVar1,"or",2);
                        if (iVar8 == 0) {
                          token = LYXP_TOKEN_OPER_LOG;
                          goto LAB_001a7c1f;
                        }
                        iVar8 = strncmp(pcVar1,"and",3);
                        if (iVar8 == 0) {
                          token = LYXP_TOKEN_OPER_LOG;
                          str_len = 3;
                          goto LAB_001a7bc5;
                        }
                        iVar8 = strncmp(pcVar1,"mod",3);
                        if ((iVar8 == 0) || (iVar8 = strncmp(pcVar1,"div",3), iVar8 == 0)) {
                          str_len = 3;
                          goto LAB_001a80a9;
                        }
                        uVar12 = local_48;
                        if (bVar19 || bVar16) {
                          ly_vlog(ctx,(char *)0x0,LYVE_XPATH,
                                  "Invalid character 0x%x (\'%c\'), perhaps \"%.*s\" is supposed to be a function call."
                                  ,local_48,local_48 & 0xffffffff,
                                  CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                                           exp->tok_len[uVar17]),exp->expr + exp->tok_pos[uVar17]);
                          LVar7 = LY_EVALID;
                          goto LAB_001a8165;
                        }
                      }
                      ly_vlog(ctx,(char *)0x0,LYVE_XPATH,
                              "Invalid character \'%c\'[%u] of expression \'%s\'.",uVar12,
                              (ulong)(tok_pos + 1),pcVar5);
                      goto LAB_001a81ba;
                    }
                    token = LYXP_TOKEN_OPER_MATH;
                  }
                  else if ((byte)local_48 == 0x3d) {
                    token = LYXP_TOKEN_OPER_EQUAL;
                  }
                  else {
                    if ((byte)local_48 == 0x3e) goto LAB_001a7ea6;
                    if ((byte)local_48 != 0x7c) goto LAB_001a7eb8;
                    token = LYXP_TOKEN_OPER_UNI;
                  }
LAB_001a7bbf:
                  str_len = 1;
                  goto LAB_001a7bc5;
                }
                if ((bVar19) && (exp->used != 0)) {
                  plVar10 = exp->tokens;
                  uVar17 = exp->used - 1;
                  if (plVar10[uVar17] != LYXP_TOKEN_NAMETEST) goto LAB_001a7b85;
                  if (exp->tok_len[uVar17] != 7) {
                    if (exp->tok_len[uVar17] == 4) {
                      uVar4 = exp->tok_pos[uVar17];
                      iVar8 = strncmp(pcVar5 + uVar4,"node",4);
                      if ((iVar8 == 0) || (iVar8 = strncmp(pcVar5 + uVar4,"text",4), iVar8 == 0))
                      goto LAB_001a7c82;
                    }
                    goto LAB_001a7b85;
                  }
                  iVar8 = strncmp(pcVar5 + exp->tok_pos[uVar17],"comment",7);
                  if (iVar8 != 0) goto LAB_001a7b85;
LAB_001a7c82:
                  plVar10[uVar17] = LYXP_TOKEN_NODETYPE;
                  token = LYXP_TOKEN_PAR1;
                  str_len = 1;
LAB_001a7c95:
                  bVar16 = false;
                  bVar19 = false;
                }
                else {
LAB_001a7b85:
                  token = LYXP_TOKEN_PAR1;
                  str_len = 1;
                  if ((bVar16) && (exp->used != 0)) {
                    uVar17 = exp->used - 1;
                    if (exp->tokens[uVar17] == LYXP_TOKEN_NAMETEST) {
                      exp->tokens[uVar17] = LYXP_TOKEN_FUNCNAME;
                      token = LYXP_TOKEN_PAR1;
                      goto LAB_001a7c95;
                    }
                  }
                }
LAB_001a7bc5:
                LVar7 = exp_add_token(ctx,exp,token,(uint32_t)lVar18,(uint32_t)str_len);
                pplVar6 = local_38;
                if (LVar7 != LY_SUCCESS) goto LAB_001a8165;
                for (lVar18 = lVar18 + str_len; uVar12 = (ulong)(byte)pcVar5[lVar18], uVar12 < 0x21;
                    lVar18 = lVar18 + 1) {
                  if ((0x100002600U >> (uVar12 & 0x3f) & 1) == 0) {
                    if (uVar12 == 0) {
                      if ((char)local_3c != '\0') {
                        pplVar15 = (lyxp_expr_type **)calloc((ulong)exp->size,8);
                        exp->repeat = pplVar15;
                        if (pplVar15 == (lyxp_expr_type **)0x0) goto LAB_001a8140;
                        LVar9 = reparse_or_expr(ctx,exp,&local_4c,0);
                        LVar7 = LY_EVALID;
                        if (LVar9 != LY_SUCCESS) goto LAB_001a8165;
                        if (local_4c < exp->used) {
                          ly_vlog(ctx,(char *)0x0,LYVE_XPATH,
                                  "Unparsed characters \"%s\" left at the end of an XPath expression."
                                  ,exp->expr + exp->tok_pos[local_4c]);
                          goto LAB_001a8165;
                        }
                      }
                      print_expr_struct_debug(exp);
                      *pplVar6 = exp;
                      return LY_SUCCESS;
                    }
                    break;
                  }
                }
              } while( true );
            }
          }
        }
      }
LAB_001a8140:
      LVar7 = LY_EMEM;
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyxp_expr_parse");
      goto LAB_001a8165;
    }
    ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"XPath expression cannot be longer than %u characters.",
            0xffffffff);
  }
  return LY_EVALID;
LAB_001a819f:
  ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Unterminated string delimited with %c (%.15s).",
          (ulong)(uint)(int)(char)bVar3,pcVar1);
LAB_001a81ba:
  LVar7 = LY_EVALID;
LAB_001a8165:
  lyxp_expr_free(ctx,exp);
  return LVar7;
}

Assistant:

LY_ERR
lyxp_expr_parse(const struct ly_ctx *ctx, const char *expr_str, size_t expr_len, ly_bool reparse, struct lyxp_expr **expr_p)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxp_expr *expr;
    size_t parsed = 0, tok_len;
    enum lyxp_token tok_type;
    ly_bool prev_func_check = 0, prev_ntype_check = 0, has_axis;
    uint32_t tok_idx = 0;
    ssize_t ncname_len;

    assert(expr_p);

    if (!expr_str[0]) {
        LOGVAL(ctx, LY_VCODE_XP_EOF);
        return LY_EVALID;
    }

    if (!expr_len) {
        expr_len = strlen(expr_str);
    }
    if (expr_len > UINT32_MAX) {
        LOGVAL(ctx, LYVE_XPATH, "XPath expression cannot be longer than %" PRIu32 " characters.", UINT32_MAX);
        return LY_EVALID;
    }

    /* init lyxp_expr structure */
    expr = calloc(1, sizeof *expr);
    LY_CHECK_ERR_GOTO(!expr, LOGMEM(ctx); ret = LY_EMEM, error);
    LY_CHECK_GOTO(ret = lydict_insert(ctx, expr_str, expr_len, &expr->expr), error);
    expr->used = 0;
    expr->size = LYXP_EXPR_SIZE_START;
    expr->tokens = malloc(expr->size * sizeof *expr->tokens);
    LY_CHECK_ERR_GOTO(!expr->tokens, LOGMEM(ctx); ret = LY_EMEM, error);

    expr->tok_pos = malloc(expr->size * sizeof *expr->tok_pos);
    LY_CHECK_ERR_GOTO(!expr->tok_pos, LOGMEM(ctx); ret = LY_EMEM, error);

    expr->tok_len = malloc(expr->size * sizeof *expr->tok_len);
    LY_CHECK_ERR_GOTO(!expr->tok_len, LOGMEM(ctx); ret = LY_EMEM, error);

    /* make expr 0-terminated */
    expr_str = expr->expr;

    while (is_xmlws(expr_str[parsed])) {
        ++parsed;
    }

    do {
        if (expr_str[parsed] == '(') {

            /* '(' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_PAR1;

            if (prev_ntype_check && expr->used && (expr->tokens[expr->used - 1] == LYXP_TOKEN_NAMETEST) &&
                    (((expr->tok_len[expr->used - 1] == 4) &&
                    (!strncmp(&expr_str[expr->tok_pos[expr->used - 1]], "node", 4) ||
                    !strncmp(&expr_str[expr->tok_pos[expr->used - 1]], "text", 4))) ||
                    ((expr->tok_len[expr->used - 1] == 7) &&
                    !strncmp(&expr_str[expr->tok_pos[expr->used - 1]], "comment", 7)))) {
                /* it is NodeType after all */
                expr->tokens[expr->used - 1] = LYXP_TOKEN_NODETYPE;

                prev_ntype_check = 0;
                prev_func_check = 0;
            } else if (prev_func_check && expr->used && (expr->tokens[expr->used - 1] == LYXP_TOKEN_NAMETEST)) {
                /* it is FunctionName after all */
                expr->tokens[expr->used - 1] = LYXP_TOKEN_FUNCNAME;

                prev_ntype_check = 0;
                prev_func_check = 0;
            }

        } else if (expr_str[parsed] == ')') {

            /* ')' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_PAR2;

        } else if (expr_str[parsed] == '[') {

            /* '[' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_BRACK1;

        } else if (expr_str[parsed] == ']') {

            /* ']' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_BRACK2;

        } else if (!strncmp(&expr_str[parsed], "..", 2)) {

            /* '..' */
            tok_len = 2;
            tok_type = LYXP_TOKEN_DDOT;

        } else if ((expr_str[parsed] == '.') && (!isdigit(expr_str[parsed + 1]))) {

            /* '.' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_DOT;

        } else if (expr_str[parsed] == '@') {

            /* '@' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_AT;

        } else if (expr_str[parsed] == ',') {

            /* ',' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_COMMA;

        } else if (expr_str[parsed] == '\'') {

            /* Literal with ' */
            for (tok_len = 1; (expr_str[parsed + tok_len] != '\0') && (expr_str[parsed + tok_len] != '\''); ++tok_len) {}
            LY_CHECK_ERR_GOTO(expr_str[parsed + tok_len] == '\0',
                    LOGVAL(ctx, LY_VCODE_XP_EOE, expr_str[parsed], &expr_str[parsed]); ret = LY_EVALID,
                    error);
            ++tok_len;
            tok_type = LYXP_TOKEN_LITERAL;

        } else if (expr_str[parsed] == '\"') {

            /* Literal with " */
            for (tok_len = 1; (expr_str[parsed + tok_len] != '\0') && (expr_str[parsed + tok_len] != '\"'); ++tok_len) {}
            LY_CHECK_ERR_GOTO(expr_str[parsed + tok_len] == '\0',
                    LOGVAL(ctx, LY_VCODE_XP_EOE, expr_str[parsed], &expr_str[parsed]); ret = LY_EVALID,
                    error);
            ++tok_len;
            tok_type = LYXP_TOKEN_LITERAL;

        } else if ((expr_str[parsed] == '.') || (isdigit(expr_str[parsed]))) {

            /* Number */
            for (tok_len = 0; isdigit(expr_str[parsed + tok_len]); ++tok_len) {}
            if (expr_str[parsed + tok_len] == '.') {
                ++tok_len;
                for ( ; isdigit(expr_str[parsed + tok_len]); ++tok_len) {}
            }
            tok_type = LYXP_TOKEN_NUMBER;

        } else if (expr_str[parsed] == '$') {

            /* VariableReference */
            parsed++;
            ncname_len = parse_ncname(&expr_str[parsed]);
            LY_CHECK_ERR_GOTO(ncname_len < 1, LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed - ncname_len],
                    (uint32_t)(parsed - ncname_len + 1), expr_str); ret = LY_EVALID, error);
            tok_len = ncname_len;
            LY_CHECK_ERR_GOTO(expr_str[parsed + tok_len] == ':',
                    LOGVAL(ctx, LYVE_XPATH, "Variable with prefix is not supported."); ret = LY_EVALID,
                    error);
            tok_type = LYXP_TOKEN_VARREF;

        } else if (expr_str[parsed] == '/') {

            /* Operator '/', '//' */
            if (!strncmp(&expr_str[parsed], "//", 2)) {
                tok_len = 2;
                tok_type = LYXP_TOKEN_OPER_RPATH;
            } else {
                tok_len = 1;
                tok_type = LYXP_TOKEN_OPER_PATH;
            }

        } else if (!strncmp(&expr_str[parsed], "!=", 2)) {

            /* Operator '!=' */
            tok_len = 2;
            tok_type = LYXP_TOKEN_OPER_NEQUAL;

        } else if (!strncmp(&expr_str[parsed], "<=", 2) || !strncmp(&expr_str[parsed], ">=", 2)) {

            /* Operator '<=', '>=' */
            tok_len = 2;
            tok_type = LYXP_TOKEN_OPER_COMP;

        } else if (expr_str[parsed] == '|') {

            /* Operator '|' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPER_UNI;

        } else if ((expr_str[parsed] == '+') || (expr_str[parsed] == '-')) {

            /* Operator '+', '-' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPER_MATH;

        } else if (expr_str[parsed] == '=') {

            /* Operator '=' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPER_EQUAL;

        } else if ((expr_str[parsed] == '<') || (expr_str[parsed] == '>')) {

            /* Operator '<', '>' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPER_COMP;

        } else if (expr->used && (expr->tokens[expr->used - 1] != LYXP_TOKEN_AT) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_PAR1) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_BRACK1) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_COMMA) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_LOG) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_EQUAL) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_NEQUAL) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_COMP) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_MATH) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_UNI) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_PATH) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_RPATH)) {

            /* Operator '*', 'or', 'and', 'mod', or 'div' */
            if (expr_str[parsed] == '*') {
                tok_len = 1;
                tok_type = LYXP_TOKEN_OPER_MATH;

            } else if (!strncmp(&expr_str[parsed], "or", 2)) {
                tok_len = 2;
                tok_type = LYXP_TOKEN_OPER_LOG;

            } else if (!strncmp(&expr_str[parsed], "and", 3)) {
                tok_len = 3;
                tok_type = LYXP_TOKEN_OPER_LOG;

            } else if (!strncmp(&expr_str[parsed], "mod", 3) || !strncmp(&expr_str[parsed], "div", 3)) {
                tok_len = 3;
                tok_type = LYXP_TOKEN_OPER_MATH;

            } else if (prev_ntype_check || prev_func_check) {
                LOGVAL(ctx, LYVE_XPATH,
                        "Invalid character 0x%x ('%c'), perhaps \"%.*s\" is supposed to be a function call.",
                        expr_str[parsed], expr_str[parsed], (int)expr->tok_len[expr->used - 1],
                        &expr->expr[expr->tok_pos[expr->used - 1]]);
                ret = LY_EVALID;
                goto error;
            } else {
                LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed], (uint32_t)(parsed + 1), expr_str);
                ret = LY_EVALID;
                goto error;
            }
        } else {

            /* (AxisName '::')? ((NCName ':')? '*' | QName) or NodeType/FunctionName */
            if (expr_str[parsed] == '*') {
                ncname_len = 1;
            } else {
                ncname_len = parse_ncname(&expr_str[parsed]);
                LY_CHECK_ERR_GOTO(ncname_len < 1, LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed - ncname_len],
                        (uint32_t)(parsed - ncname_len + 1), expr_str); ret = LY_EVALID, error);
            }
            tok_len = ncname_len;

            has_axis = 0;
            if (!strncmp(&expr_str[parsed + tok_len], "::", 2)) {
                /* axis */
                LY_CHECK_ERR_GOTO(expr_parse_axis(&expr_str[parsed], ncname_len),
                        LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed], (uint32_t)(parsed + 1), expr_str); ret = LY_EVALID,
                        error);
                tok_type = LYXP_TOKEN_AXISNAME;

                LY_CHECK_GOTO(ret = exp_add_token(ctx, expr, tok_type, parsed, tok_len), error);
                parsed += tok_len;

                /* '::' */
                tok_len = 2;
                tok_type = LYXP_TOKEN_DCOLON;

                LY_CHECK_GOTO(ret = exp_add_token(ctx, expr, tok_type, parsed, tok_len), error);
                parsed += tok_len;

                if (expr_str[parsed] == '*') {
                    ncname_len = 1;
                } else {
                    ncname_len = parse_ncname(&expr_str[parsed]);
                    LY_CHECK_ERR_GOTO(ncname_len < 1, LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed - ncname_len],
                            (uint32_t)(parsed - ncname_len + 1), expr_str); ret = LY_EVALID, error);
                }
                tok_len = ncname_len;

                has_axis = 1;
            }

            if (expr_str[parsed + tok_len] == ':') {
                ++tok_len;
                if (expr_str[parsed + tok_len] == '*') {
                    ++tok_len;
                } else {
                    ncname_len = parse_ncname(&expr_str[parsed + tok_len]);
                    LY_CHECK_ERR_GOTO(ncname_len < 1, LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed - ncname_len],
                            (uint32_t)(parsed - ncname_len + 1), expr_str); ret = LY_EVALID, error);
                    tok_len += ncname_len;
                }
                /* remove old flags to prevent ambiguities */
                prev_ntype_check = 0;
                prev_func_check = 0;
                tok_type = LYXP_TOKEN_NAMETEST;
            } else {
                /* if not '*', there is no prefix so it can still be NodeType/FunctionName, we can't finally decide now */
                prev_ntype_check = (expr_str[parsed] == '*') ? 0 : 1;
                prev_func_check = (prev_ntype_check && !has_axis) ? 1 : 0;
                tok_type = LYXP_TOKEN_NAMETEST;
            }
        }

        /* store the token, move on to the next one */
        LY_CHECK_GOTO(ret = exp_add_token(ctx, expr, tok_type, parsed, tok_len), error);
        parsed += tok_len;
        while (is_xmlws(expr_str[parsed])) {
            ++parsed;
        }

    } while (expr_str[parsed]);

    if (reparse) {
        /* prealloc repeat */
        expr->repeat = calloc(expr->size, sizeof *expr->repeat);
        LY_CHECK_ERR_GOTO(!expr->repeat, LOGMEM(ctx); ret = LY_EMEM, error);

        /* fill repeat */
        LY_CHECK_ERR_GOTO(reparse_or_expr(ctx, expr, &tok_idx, 0), ret = LY_EVALID, error);
        if (expr->used > tok_idx) {
            LOGVAL(ctx, LYVE_XPATH, "Unparsed characters \"%s\" left at the end of an XPath expression.",
                    &expr->expr[expr->tok_pos[tok_idx]]);
            ret = LY_EVALID;
            goto error;
        }
    }

    print_expr_struct_debug(expr);
    *expr_p = expr;
    return LY_SUCCESS;

error:
    lyxp_expr_free(ctx, expr);
    return ret;
}